

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int lhRecordLookup(lhash_kv_engine *pEngine,void *pKey,sxu32 nByte,lhcell **ppCell)

{
  uint nHash_00;
  lhcell *plVar1;
  int rc;
  sxu32 nHash;
  pgno iBucket;
  lhcell *pCell;
  lhpage *pPage;
  lhash_bmap_rec *pRec;
  lhcell **ppCell_local;
  void *pvStack_20;
  sxu32 nByte_local;
  void *pKey_local;
  lhash_kv_engine *pEngine_local;
  
  pRec = (lhash_bmap_rec *)ppCell;
  ppCell_local._4_4_ = nByte;
  pvStack_20 = pKey;
  pKey_local = pEngine;
  pEngine_local._4_4_ = (*pEngine->pIo->xGet)(pEngine->pIo->pHandle,1,&pEngine->pHeader);
  if (pEngine_local._4_4_ == 0) {
    nHash_00 = (**(code **)((long)pKey_local + 0xc0))(pvStack_20,ppCell_local._4_4_);
    _rc = (ulong)nHash_00 & *(long *)((long)pKey_local + 0x130) - 1U;
    if ((ulong)(*(long *)((long)pKey_local + 0x120) + *(long *)((long)pKey_local + 0x128)) <= _rc) {
      _rc = (ulong)nHash_00 & *(long *)((long)pKey_local + 0x128) - 1U;
    }
    pPage = (lhpage *)lhMapFindBucket((lhash_kv_engine *)pKey_local,_rc);
    if (pPage == (lhpage *)0x0) {
      pEngine_local._4_4_ = -6;
    }
    else {
      pEngine_local._4_4_ =
           lhLoadPage((lhash_kv_engine *)pKey_local,(pgno)pPage->pRaw,(lhpage *)0x0,
                      (lhpage **)&pCell,0);
      if (pEngine_local._4_4_ == 0) {
        plVar1 = lhFindCell((lhpage *)pCell,pvStack_20,ppCell_local._4_4_,nHash_00);
        if (plVar1 == (lhcell *)0x0) {
          pEngine_local._4_4_ = -6;
        }
        else {
          if (pRec != (lhash_bmap_rec *)0x0) {
            pRec->iLogic = (pgno)plVar1;
          }
          pEngine_local._4_4_ = 0;
        }
      }
    }
  }
  return pEngine_local._4_4_;
}

Assistant:

static int lhRecordLookup(
	lhash_kv_engine *pEngine, /* KV storage engine */
	const void *pKey,         /* Lookup key */
	sxu32 nByte,              /* Key length */
	lhcell **ppCell           /* OUT: Target cell on success */
	)
{
	lhash_bmap_rec *pRec;
	lhpage *pPage;
	lhcell *pCell;
	pgno iBucket;
	sxu32 nHash;
	int rc;
	/* Acquire the first page (hash Header) so that everything gets loaded autmatically */
	rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,1,&pEngine->pHeader);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	/* Compute the hash of the key first */
	nHash = pEngine->xHash(pKey,nByte);
	/* Extract the logical (i.e. not real) page number */
	iBucket = nHash & (pEngine->nmax_split_nucket - 1);
	if( iBucket >= (pEngine->split_bucket + pEngine->max_split_bucket) ){
		/* Low mask */
		iBucket = nHash & (pEngine->max_split_bucket - 1);
	}
	/* Map the logical bucket number to real page number */
	pRec = lhMapFindBucket(pEngine,iBucket);
	if( pRec == 0 ){
		/* No such entry */
		return UNQLITE_NOTFOUND;
	}
	/* Load the master page and it's slave page in-memory  */
	rc = lhLoadPage(pEngine,pRec->iReal,0,&pPage,0);
	if( rc != UNQLITE_OK ){
		/* IO error, unlikely scenario */
		return rc;
	}
	/* Lookup for the cell */
	pCell = lhFindCell(pPage,pKey,nByte,nHash);
	if( pCell == 0 ){
		/* No such entry */
		return UNQLITE_NOTFOUND;
	}
	if( ppCell ){
		*ppCell = pCell;
	}
	return UNQLITE_OK;
}